

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsPendulum_dns.c
# Opt level: O2

int GetSol(void *cvode_mem,N_Vector yy0,sunrealtype rtol,sunrealtype atol,sunrealtype tf,int nout,
          int proj,int projerr,N_Vector yref)

{
  int iVar1;
  undefined8 uVar2;
  double *pdVar3;
  char *__format;
  double dVar4;
  int retval;
  sunrealtype local_128;
  FILE *local_120;
  undefined8 local_118;
  sunrealtype local_110;
  double *local_108;
  int local_fc;
  sunrealtype local_f8;
  undefined8 uStack_f0;
  double local_e8;
  N_Vector local_e0;
  long netf;
  long ncfn;
  long nfeLS;
  long nje;
  long nsetups;
  long nfe;
  long nst;
  sunrealtype t;
  char outname [100];
  
  local_128 = atol;
  local_110 = rtol;
  local_f8 = tf;
  local_e0 = yref;
  if (proj == 0) {
    retval = CVodeSetProjFrequency(cvode_mem,0);
    iVar1 = check_retval(&retval,"CVodeSetProjFrequency",1);
    if (iVar1 != 0) {
      return 1;
    }
    printf("  NO    ");
  }
  else {
    printf("  YES   ");
    retval = CVodeSetProjFrequency(cvode_mem,1);
    iVar1 = check_retval(&retval,"CVodeSetProjFrequency",1);
    if (iVar1 != 0) {
      return 1;
    }
    retval = CVodeSetProjErrEst(cvode_mem,projerr);
    iVar1 = check_retval(&retval,"CVodeSetProjErrEst",1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  uVar2 = N_VNew_Serial(4,sunctx);
  N_VScale(0x3ff0000000000000,yy0,uVar2);
  pdVar3 = (double *)N_VGetArrayPointer(uVar2);
  retval = CVodeReInit(0,cvode_mem,yy0);
  iVar1 = check_retval(&retval,"CVodeReInit",1);
  if (iVar1 == 0) {
    local_108 = pdVar3;
    retval = CVodeSStolerances(local_110,local_128,cvode_mem);
    iVar1 = check_retval(&retval,"CVodeSStolerances",1);
    if (iVar1 == 0) {
      __format = "cvsPendulum_dns_rtol_%03.2e_atol_%03.2e_proj.txt";
      if (proj == 0) {
        __format = "cvsPendulum_dns_rtol_%03.2e_atol_%03.2e.txt";
      }
      local_118 = uVar2;
      sprintf(outname,__format,local_110,local_128);
      local_120 = fopen(outname,"w");
      fprintf(local_120,"%24.16e %24.16e %24.16e %24.16e %24.16e\n",0,*local_108,local_108[1],
              local_108[2],local_108[3]);
      dVar4 = local_f8 / (double)nout;
      local_fc = nout + -1;
      iVar1 = 0;
      if (nout < 1) {
        nout = iVar1;
      }
      local_e8 = dVar4;
      while( true ) {
        if (nout == iVar1) {
          fclose(local_120);
          pdVar3 = local_108;
          uVar2 = local_118;
          local_f8 = ABS(*local_108 * *local_108 + local_108[1] * local_108[1] + -1.0);
          uStack_f0 = 0;
          N_VLinearSum(0x3ff0000000000000,local_118,local_e0,local_118);
          N_VAbs(uVar2,uVar2);
          printf("%8.2e  %8.2e  %8.2e  %8.2e  |  %8.2e  |",*pdVar3,pdVar3[1],pdVar3[2],pdVar3[3],
                 local_f8);
          N_VDestroy_Serial(uVar2);
          retval = CVodeGetNumSteps(cvode_mem,&nst);
          iVar1 = check_retval(&retval,"CVodeGetNumSteps",1);
          if (iVar1 != 0) {
            return retval;
          }
          retval = CVodeGetNumRhsEvals(cvode_mem,&nfe);
          iVar1 = check_retval(&retval,"CVodeGetNumFctEvals",1);
          if (iVar1 != 0) {
            return retval;
          }
          retval = CVodeGetNumLinSolvSetups(cvode_mem,&nsetups);
          iVar1 = check_retval(&retval,"CVodeGetNumLinSolvSetups",1);
          if (iVar1 != 0) {
            return retval;
          }
          retval = CVodeGetNumErrTestFails(cvode_mem,&netf);
          iVar1 = check_retval(&retval,"CVodeGetNumErrTestFails",1);
          if (iVar1 != 0) {
            return retval;
          }
          retval = CVodeGetNumNonlinSolvConvFails(cvode_mem,&ncfn);
          iVar1 = check_retval(&retval,"CVodeGetNumNonlinSolvConvFails",1);
          if (iVar1 != 0) {
            return retval;
          }
          retval = CVodeGetNumJacEvals(cvode_mem,&nje);
          iVar1 = check_retval(&retval,"CVodeGetNumJacEvals",1);
          if (iVar1 != 0) {
            return retval;
          }
          retval = CVodeGetNumLinRhsEvals(cvode_mem,&nfeLS);
          iVar1 = check_retval(&retval,"CVodeGetNumLinRhsEvals",1);
          if (iVar1 != 0) {
            return retval;
          }
          printf(" %6ld   %6ld+%-4ld     %4ld (%3ld)     |  %3ld  %3ld\n",nst,nfe,nfeLS,nsetups,nje,
                 ncfn,netf);
          return 0;
        }
        local_110 = (sunrealtype)CONCAT44(local_110._4_4_,iVar1);
        local_128 = dVar4;
        retval = CVodeSetStopTime(dVar4,cvode_mem);
        iVar1 = check_retval(&retval,"CVodeSetStopTime",1);
        if (iVar1 != 0) break;
        retval = CVode(local_128,cvode_mem,local_118,&t,1);
        iVar1 = check_retval(&retval,"CVode",1);
        if (iVar1 != 0) break;
        fprintf(local_120,"%24.16e %24.16e %24.16e %24.16e %24.16e\n",t,*local_108,local_108[1],
                local_108[2],local_108[3]);
        dVar4 = local_f8;
        if (local_110._0_4_ < local_fc) {
          dVar4 = local_128 + local_e8;
        }
        iVar1 = local_110._0_4_ + 1;
      }
      N_VDestroy_Serial(local_118);
      fclose(local_120);
      return retval;
    }
  }
  N_VDestroy_Serial(uVar2);
  return retval;
}

Assistant:

int GetSol(void* cvode_mem, N_Vector yy0, sunrealtype rtol, sunrealtype atol,
           sunrealtype tf, int nout, sunbooleantype proj,
           sunbooleantype projerr, N_Vector yref)
{
  char outname[100];          /* output file name */
  FILE* FID           = NULL; /* output file      */
  N_Vector yy         = NULL; /* solution vector  */
  sunrealtype* yydata = NULL; /* vector data      */

  int retval;         /* reusable return flag */
  int out;            /* output counter       */
  sunrealtype dtout;  /* output frequency     */
  sunrealtype tout;   /* output time          */
  sunrealtype t;      /* return time          */
  sunrealtype x, y;   /* position values      */
  sunrealtype xd, yd; /* velocity values      */
  sunrealtype g;      /* constraint value     */

  /* Integrator stats */
  long int nst, nfe, nsetups, nje, nfeLS, ncfn, netf;

  /* Enable or disable projection */
  if (proj)
  {
    printf("  YES   ");
    retval = CVodeSetProjFrequency(cvode_mem, 1);
    if (check_retval(&retval, "CVodeSetProjFrequency", 1)) { return (1); }

    /* Enable or disable error projection */
    retval = CVodeSetProjErrEst(cvode_mem, projerr);
    if (check_retval(&retval, "CVodeSetProjErrEst", 1)) { return (1); }
  }
  else
  {
    retval = CVodeSetProjFrequency(cvode_mem, 0);
    if (check_retval(&retval, "CVodeSetProjFrequency", 1)) { return (1); }
    printf("  NO    ");
  }

  /* Create vector to store the solution */
  yy = N_VNew_Serial(4, sunctx);

  /* Copy initial condition into solution vector */
  N_VScale(ONE, yy0, yy);

  /* Get pointer to vector data */
  yydata = N_VGetArrayPointer(yy);

  /* Reinitialize CVODES for this run */
  retval = CVodeReInit(cvode_mem, ZERO, yy0);
  if (check_retval(&retval, "CVodeReInit", 1))
  {
    N_VDestroy_Serial(yy);
    return (retval);
  }

  /* Set integration tolerances for this run */
  retval = CVodeSStolerances(cvode_mem, rtol, atol);
  if (check_retval(&retval, "CVodeSStolerances", 1))
  {
    N_VDestroy_Serial(yy);
    return (retval);
  }

  /* Open output file */
  if (proj)
  {
    sprintf(outname,
            "cvsPendulum_dns_rtol_%03.2" ESYM "_atol_%03.2" ESYM "_proj.txt",
            rtol, atol);
  }
  else
  {
    sprintf(outname, "cvsPendulum_dns_rtol_%03.2" ESYM "_atol_%03.2" ESYM ".txt",
            rtol, atol);
  }
  FID = fopen(outname, "w");

  /* Output initial condition */
  fprintf(FID,
          "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM
          " %24.16" ESYM "\n",
          ZERO, yydata[0], yydata[1], yydata[2], yydata[3]);

  /* Integrate to tf and peridoically output the solution */
  dtout = tf / nout;
  tout  = dtout;

  for (out = 0; out < nout; out++)
  {
    /* Set stop time (do not interpolate output) */
    retval = CVodeSetStopTime(cvode_mem, tout);
    if (check_retval(&retval, "CVodeSetStopTime", 1))
    {
      N_VDestroy_Serial(yy);
      fclose(FID);
      return (retval);
    }

    /* Integrate to tout */
    retval = CVode(cvode_mem, tout, yy, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1))
    {
      N_VDestroy_Serial(yy);
      fclose(FID);
      return (retval);
    }

    /* Write output */
    fprintf(FID,
            "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM
            " %24.16" ESYM "\n",
            t, yydata[0], yydata[1], yydata[2], yydata[3]);

    /* Update output time */
    if (out < nout - 1) { tout += dtout; }
    else { tout = tf; }
  }

  /* Close output file */
  fclose(FID);

  /* Compute the constraint violation */
  x = yydata[0];
  y = yydata[1];
  g = ABS(x * x + y * y - ONE);

  /* Compute the absolute error compared to the reference solution */
  N_VLinearSum(ONE, yy, -ONE, yref, yy);
  N_VAbs(yy, yy);

  x  = yydata[0];
  y  = yydata[1];
  xd = yydata[2];
  yd = yydata[3];

  /* Output errors */
  printf("%8.2" ESYM "  %8.2" ESYM "  %8.2" ESYM "  %8.2" ESYM "  |  %8.2" ESYM
         "  |",
         x, y, xd, yd, g);

  /* Free solution vector */
  N_VDestroy_Serial(yy);

  /* Get integrator stats */
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  if (check_retval(&retval, "CVodeGetNumSteps", 1)) { return (retval); }

  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  if (check_retval(&retval, "CVodeGetNumFctEvals", 1)) { return (retval); }

  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  if (check_retval(&retval, "CVodeGetNumLinSolvSetups", 1)) { return (retval); }

  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  if (check_retval(&retval, "CVodeGetNumErrTestFails", 1)) { return (retval); }

  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  if (check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1))
  {
    return (retval);
  }

  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  if (check_retval(&retval, "CVodeGetNumJacEvals", 1)) { return (retval); }

  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  if (check_retval(&retval, "CVodeGetNumLinRhsEvals", 1)) { return (retval); }

  /* Output stats */
  printf(" %6ld   %6ld+%-4ld     %4ld (%3ld)     |  %3ld  %3ld\n", nst, nfe,
         nfeLS, nsetups, nje, ncfn, netf);

  return (0);
}